

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sspm.cpp
# Opt level: O0

bool __thiscall pg::SSPMSolver::lift(SSPMSolver *this,int v,int target,int *str,int pl)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  _label_vertex _Var5;
  int local_13c;
  _label_vertex local_120;
  Game *local_110;
  int local_108;
  _label_vertex local_100;
  Game *local_f0;
  int local_e8;
  _label_vertex local_e0;
  int local_cc;
  int *piStack_c8;
  int to;
  int *curedge;
  Game *pGStack_b8;
  bool first;
  int local_b0;
  _label_vertex local_a8;
  Game *local_98;
  int local_90;
  _label_vertex local_88;
  Game *local_78;
  int local_70;
  _label_vertex local_68;
  Game *local_58;
  int local_50;
  _label_vertex local_48;
  int local_34;
  uint local_30;
  int pindex;
  int pr;
  int pl_local;
  int *str_local;
  int target_local;
  int v_local;
  SSPMSolver *this_local;
  
  if (this->pm_d[this->l * v] == -1) {
    this_local._7_1_ = false;
  }
  else {
    pindex = pl;
    _pr = str;
    str_local._0_4_ = target;
    str_local._4_4_ = v;
    _target_local = this;
    local_30 = Solver::priority(&this->super_Solver,v);
    if (pindex == 0) {
      local_13c = this->h - (int)(local_30 + 1) / 2;
    }
    else {
      local_13c = this->h - (int)local_30 / 2;
    }
    local_13c = local_13c + -1;
    local_34 = local_13c;
    if (1 < (this->super_Solver).trace) {
      poVar3 = std::operator<<((this->super_Solver).logger,"\x1b[37;1mupdating vertex ");
      _Var5 = Solver::label_vertex(&this->super_Solver,str_local._4_4_);
      local_58 = _Var5.g;
      local_50 = _Var5.v;
      local_48.g = local_58;
      local_48.v = local_50;
      poVar3 = operator<<(poVar3,&local_48);
      poVar3 = std::operator<<(poVar3," (");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_30);
      poVar3 = std::operator<<(poVar3," => ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_34);
      poVar3 = std::operator<<(poVar3,")");
      iVar2 = Solver::owner(&this->super_Solver,str_local._4_4_);
      pcVar4 = " (even)";
      if (iVar2 != 0) {
        pcVar4 = " (odd)";
      }
      poVar3 = std::operator<<(poVar3,pcVar4);
      std::operator<<(poVar3,"\x1b[m with current measure");
      stream_pm(this,(this->super_Solver).logger,str_local._4_4_);
      std::ostream::operator<<((this->super_Solver).logger,std::endl<char,std::char_traits<char>>);
    }
    iVar2 = Solver::owner(&this->super_Solver,str_local._4_4_);
    if ((iVar2 == pindex) && ((int)str_local != -1)) {
      to_tmp(this,(int)str_local);
      if (pindex == (local_30 & 1)) {
        prog_tmp(this,local_34,this->h);
      }
      else {
        trunc_tmp(this,local_34);
      }
      to_best(this,str_local._4_4_);
      iVar2 = compare(this,local_34);
      if (iVar2 < 1) {
        this_local._7_1_ = false;
      }
      else {
        from_tmp(this,str_local._4_4_);
        if (1 < (this->super_Solver).trace) {
          poVar3 = std::operator<<((this->super_Solver).logger,"to successor ");
          _Var5 = Solver::label_vertex(&this->super_Solver,(int)str_local);
          local_78 = _Var5.g;
          local_70 = _Var5.v;
          local_68.g = local_78;
          local_68.v = local_70;
          poVar3 = operator<<(poVar3,&local_68);
          std::operator<<(poVar3,":");
          stream_tmp(this,(this->super_Solver).logger,this->h);
          std::operator<<((this->super_Solver).logger," =>");
        }
        if (pindex == (local_30 & 1)) {
          prog_tmp(this,local_34,this->h);
        }
        else {
          trunc_tmp(this,local_34);
        }
        if (1 < (this->super_Solver).trace) {
          stream_tmp(this,(this->super_Solver).logger,this->h);
          std::ostream::operator<<
                    ((this->super_Solver).logger,std::endl<char,std::char_traits<char>>);
        }
        if (0 < (this->super_Solver).trace) {
          poVar3 = std::operator<<((this->super_Solver).logger,
                                   "\x1b[32;1mnew measure\x1b[m of \x1b[36;1m");
          _Var5 = Solver::label_vertex(&this->super_Solver,str_local._4_4_);
          local_98 = _Var5.g;
          local_90 = _Var5.v;
          local_88.g = local_98;
          local_88.v = local_90;
          poVar3 = operator<<(poVar3,&local_88);
          std::operator<<(poVar3,"\x1b[m:");
          stream_tmp(this,(this->super_Solver).logger,this->h);
          poVar3 = std::operator<<((this->super_Solver).logger," (to ");
          _Var5 = Solver::label_vertex(&this->super_Solver,(int)str_local);
          pGStack_b8 = _Var5.g;
          local_b0 = _Var5.v;
          local_a8.g = pGStack_b8;
          local_a8.v = local_b0;
          poVar3 = operator<<(poVar3,&local_a8);
          std::operator<<(poVar3,")\n");
        }
        this_local._7_1_ = true;
      }
    }
    else {
      curedge._7_1_ = 1;
      for (piStack_c8 = Solver::outs(&this->super_Solver,str_local._4_4_); *piStack_c8 != -1;
          piStack_c8 = piStack_c8 + 1) {
        local_cc = *piStack_c8;
        bVar1 = bitset::operator[]((this->super_Solver).disabled,(long)local_cc);
        if (!bVar1) {
          to_tmp(this,local_cc);
          if (1 < (this->super_Solver).trace) {
            poVar3 = std::operator<<((this->super_Solver).logger,"to successor ");
            _Var5 = Solver::label_vertex(&this->super_Solver,local_cc);
            local_f0 = _Var5.g;
            local_e8 = _Var5.v;
            local_e0.g = local_f0;
            local_e0.v = local_e8;
            poVar3 = operator<<(poVar3,&local_e0);
            std::operator<<(poVar3," from");
            stream_tmp(this,(this->super_Solver).logger,this->h);
            std::operator<<((this->super_Solver).logger," =>");
          }
          if (pindex == (local_30 & 1)) {
            prog_tmp(this,local_34,this->h);
          }
          else {
            trunc_tmp(this,local_34);
          }
          if (1 < (this->super_Solver).trace) {
            stream_tmp(this,(this->super_Solver).logger,this->h);
            std::ostream::operator<<
                      ((this->super_Solver).logger,std::endl<char,std::char_traits<char>>);
          }
          if ((curedge._7_1_ & 1) == 0) {
            iVar2 = Solver::owner(&this->super_Solver,str_local._4_4_);
            if (iVar2 == pindex) {
              iVar2 = compare(this,local_34);
              if (0 < iVar2) {
                tmp_to_best(this);
                *_pr = local_cc;
              }
            }
            else {
              iVar2 = compare(this,local_34);
              if (iVar2 < 0) {
                tmp_to_best(this);
                *_pr = local_cc;
              }
            }
          }
          else {
            tmp_to_best(this);
            *_pr = local_cc;
          }
          curedge._7_1_ = 0;
        }
      }
      to_tmp(this,str_local._4_4_);
      iVar2 = compare(this,local_34);
      if (iVar2 < 0) {
        if (0 < (this->super_Solver).trace) {
          poVar3 = std::operator<<((this->super_Solver).logger,
                                   "\x1b[1;32mnew measure\x1b[m of \x1b[36;1m");
          _Var5 = Solver::label_vertex(&this->super_Solver,str_local._4_4_);
          local_110 = _Var5.g;
          local_108 = _Var5.v;
          local_100.g = local_110;
          local_100.v = local_108;
          poVar3 = operator<<(poVar3,&local_100);
          std::operator<<(poVar3,"\x1b[m:");
          stream_best(this,(this->super_Solver).logger,this->h);
          poVar3 = std::operator<<((this->super_Solver).logger," (to ");
          _Var5 = Solver::label_vertex(&this->super_Solver,*_pr);
          local_120.g = _Var5.g;
          local_120.v = _Var5.v;
          poVar3 = operator<<(poVar3,&local_120);
          std::operator<<(poVar3,")\n");
        }
        from_best(this,str_local._4_4_);
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool
SSPMSolver::lift(int v, int target, int &str, int pl)
{
    // check if already Top
    if (pm_d[l*v] == -1) return false; // already Top

    const int pr = priority(v);
    const int pindex = pl == 0 ? h-(pr+1)/2-1 : h-pr/2-1;

#ifndef NDEBUG
    if (trace >= 2) {
        logger << "\033[37;1mupdating vertex " << label_vertex(v) << " (" << pr << " => " << pindex << ")" << (owner(v)?" (odd)":" (even)") << "\033[m with current measure";
        stream_pm(logger, v);
        logger << std::endl;
    }
#endif

    // if even owns and target is set, just check if specific target is better
    if (owner(v) == pl and target != -1) {
        to_tmp(target);
        if (pl == (pr&1)) prog_tmp(pindex, h);
        else trunc_tmp(pindex);
        to_best(v);
        if (compare(pindex) > 0) {
            from_tmp(v);
#ifndef NDEBUG
            if (trace >= 2) {
                logger << "to successor " << label_vertex(target) << ":";
                stream_tmp(logger, h);
                logger << " =>";
            }
#endif
            if (pl == (pr&1)) prog_tmp(pindex, h);
            else trunc_tmp(pindex);
#ifndef NDEBUG
            if (trace >= 2) {
                stream_tmp(logger, h);
                logger << std::endl;
            }
#endif
#ifndef NDEBUG
            if (trace >= 1) {
                logger << "\033[32;1mnew measure\033[m of \033[36;1m" << label_vertex(v) << "\033[m:";
                stream_tmp(logger, h);
                logger << " (to " << label_vertex(target) << ")\n";
            }
#endif
            return true;
        } else {
            return false;
        }
    }

    // compute best measure
    bool first = true;
    for (auto curedge = outs(v); *curedge != -1; curedge++) {
        int to = *curedge;
        if (disabled[to]) continue;
        to_tmp(to);
#ifndef NDEBUG
        if (trace >= 2) {
            logger << "to successor " << label_vertex(to) << " from";
            stream_tmp(logger, h);
            logger << " =>";
        }
#endif
        if (pl == (pr&1)) prog_tmp(pindex, h);
        else trunc_tmp(pindex);
#ifndef NDEBUG
        if (trace >= 2) {
            stream_tmp(logger, h);
            logger << std::endl;
        }
#endif
        if (first) {
            tmp_to_best();
            str = to;
        } else if (owner(v) == pl) {
            // we want the max!
            if (compare(pindex) > 0) {
                tmp_to_best();
                str = to;
            }
        } else {
            // we want the min!
            if (compare(pindex) < 0) {
                tmp_to_best();
                str = to;
            }
        }
        first = false;
    }

    // set best to pm if higher
    to_tmp(v);
    if (compare(pindex) < 0) {
#ifndef NDEBUG
        if (trace >= 1) {
            logger << "\033[1;32mnew measure\033[m of \033[36;1m" << label_vertex(v) << "\033[m:";
            stream_best(logger, h);
            logger << " (to " << label_vertex(str) << ")\n";
        }
#endif
        from_best(v);
        return true;
    } else {
        return false;
    }
}